

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O2

void __thiscall
slang::driver::SourceLoader::addSearchDirectories(SourceLoader *this,string_view pattern)

{
  const_iterator __position;
  string_view pattern_00;
  error_code ec_00;
  error_code *in_stack_ffffffffffffff20;
  error_code ec;
  string_view pattern_local;
  path local_b8;
  SmallVector<std::filesystem::__cxx11::path,_2UL> directories;
  
  pattern_00._M_len = pattern._M_str;
  directories.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
       (pointer)directories.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
  directories.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
  directories.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
  ec._M_value = 0;
  pattern_local._M_len = pattern._M_len;
  pattern_local._M_str = pattern_00._M_len;
  ec._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::path(&local_b8);
  pattern_00._M_str = (char *)0x1;
  svGlob((slang *)&local_b8,(path *)pattern._M_len,pattern_00,(GlobMode)&directories,
         (SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x0,SUB81(&ec,0),
         in_stack_ffffffffffffff20);
  std::filesystem::__cxx11::path::~path(&local_b8);
  if (ec._M_value == 0) {
    __position._M_current =
         (this->searchDirectories).
         super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
    insert<std::filesystem::__cxx11::path*,void>
              ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                *)&this->searchDirectories,__position,
               directories.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_,
               directories.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ +
               directories.super_SmallVectorBase<std::filesystem::__cxx11::path>.len);
  }
  else {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_b8,&pattern_local,auto_format);
    ec_00._4_4_ = 0;
    ec_00._M_value = ec._M_value;
    __position._M_current = &local_b8;
    ec_00._M_cat = ec._M_cat;
    addError(this,__position._M_current,ec_00);
    std::filesystem::__cxx11::path::~path(&local_b8);
  }
  SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
            (&directories.super_SmallVectorBase<std::filesystem::__cxx11::path>,
             (EVP_PKEY_CTX *)__position._M_current);
  return;
}

Assistant:

void SourceLoader::addSearchDirectories(std::string_view pattern) {
    SmallVector<fs::path> directories;
    std::error_code ec;
    svGlob({}, pattern, GlobMode::Directories, directories, /* expandEnvVars */ false, ec);
    if (ec) {
        addError(pattern, ec);
        return;
    }

    searchDirectories.insert(searchDirectories.end(), directories.begin(), directories.end());
}